

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O1

int archive_write_mtree_options(archive_write *a,char *key,char *value)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  pvVar1 = a->format_data;
  uVar3 = 0;
  switch(*key) {
  case 'a':
    iVar2 = strcmp(key,"all");
    uVar3 = -(uint)(iVar2 == 0);
    break;
  case 'c':
    iVar2 = strcmp(key,"cksum");
    uVar3 = (uint)(iVar2 == 0);
    break;
  case 'd':
    iVar2 = strcmp(key,"device");
    if (iVar2 == 0) {
      uVar3 = 2;
    }
    else {
      iVar2 = strcmp(key,"dironly");
      if (iVar2 == 0) {
        *(uint *)((long)pvVar1 + 0xf4) = (uint)(value != (char *)0x0);
        goto LAB_0019b1db;
      }
    }
    break;
  case 'f':
    iVar2 = strcmp(key,"flags");
    uVar3 = (uint)(iVar2 == 0) << 3;
    break;
  case 'g':
    iVar2 = strcmp(key,"gid");
    if (iVar2 == 0) {
      uVar3 = 0x10;
    }
    else {
      iVar2 = strcmp(key,"gname");
      uVar3 = (uint)(iVar2 == 0) << 5;
    }
    break;
  case 'i':
    iVar2 = strcmp(key,"indent");
    if (iVar2 != 0) {
      iVar2 = strcmp(key,"inode");
      uVar3 = (uint)(iVar2 == 0) << 0x1a;
      break;
    }
    *(uint *)((long)pvVar1 + 0xf8) = (uint)(value != (char *)0x0);
    goto LAB_0019b1db;
  case 'l':
    iVar2 = strcmp(key,"link");
    uVar3 = (uint)(iVar2 == 0) << 0x10;
    break;
  case 'm':
    iVar2 = strcmp(key,"md5");
    if (iVar2 == 0) {
LAB_0019b0e8:
      uVar4 = 0x100;
    }
    else {
      iVar2 = strcmp(key,"md5digest");
      uVar4 = 0;
      if (iVar2 == 0) goto LAB_0019b0e8;
    }
    iVar2 = strcmp(key,"mode");
    uVar3 = 0x200;
    goto LAB_0019b104;
  case 'n':
    iVar2 = strcmp(key,"nlink");
    uVar3 = (uint)(iVar2 == 0) << 10;
    break;
  case 'r':
    iVar2 = strcmp(key,"resdevice");
    if (iVar2 == 0) {
      uVar3 = 0x8000000;
    }
    else {
      iVar2 = strcmp(key,"ripemd160digest");
      if (((iVar2 == 0) || (iVar2 = strcmp(key,"rmd160"), iVar2 == 0)) ||
         (iVar2 = strcmp(key,"rmd160digest"), iVar2 == 0)) {
        uVar3 = 0x2000;
      }
    }
    break;
  case 's':
    iVar2 = strcmp(key,"sha1");
    if (iVar2 == 0) {
LAB_0019ae83:
      uVar4 = 0x4000;
    }
    else {
      iVar2 = strcmp(key,"sha1digest");
      uVar4 = 0;
      if (iVar2 == 0) goto LAB_0019ae83;
    }
    iVar2 = strcmp(key,"sha256");
    if ((iVar2 == 0) || (iVar2 = strcmp(key,"sha256digest"), iVar2 == 0)) {
      uVar4 = 0x800000;
    }
    iVar2 = strcmp(key,"sha384");
    if ((iVar2 == 0) || (iVar2 = strcmp(key,"sha384digest"), iVar2 == 0)) {
      uVar4 = 0x1000000;
    }
    iVar2 = strcmp(key,"sha512");
    if ((iVar2 == 0) || (iVar2 = strcmp(key,"sha512digest"), iVar2 == 0)) {
      uVar4 = 0x2000000;
    }
    iVar2 = strcmp(key,"size");
    uVar3 = 0x8000;
LAB_0019b104:
    if (iVar2 != 0) {
      uVar3 = uVar4;
    }
    break;
  case 't':
    iVar2 = strcmp(key,"time");
    if (iVar2 == 0) {
      uVar3 = 0x40000;
    }
    else {
      iVar2 = strcmp(key,"type");
      uVar3 = (uint)(iVar2 == 0) << 0x13;
    }
    break;
  case 'u':
    iVar2 = strcmp(key,"uid");
    if (iVar2 == 0) {
      uVar3 = 0x100000;
    }
    else {
      iVar2 = strcmp(key,"uname");
      if (iVar2 == 0) {
        uVar3 = 0x200000;
      }
      else {
        iVar2 = strcmp(key,"use-set");
        if (iVar2 == 0) {
          *(uint *)((long)pvVar1 + 0xfc) = (uint)(value != (char *)0x0);
          goto LAB_0019b1db;
        }
      }
    }
  }
  if (uVar3 == 0) {
    iVar2 = -0x14;
  }
  else {
    if (value == (char *)0x0) {
      *(uint *)((long)pvVar1 + 0xf0) = *(uint *)((long)pvVar1 + 0xf0) & ~uVar3;
    }
    else {
      *(uint *)((long)pvVar1 + 0xf0) = *(uint *)((long)pvVar1 + 0xf0) | uVar3;
    }
LAB_0019b1db:
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
archive_write_mtree_options(struct archive_write *a, const char *key,
    const char *value)
{
	struct mtree_writer *mtree= a->format_data;
	int keybit = 0;

	switch (key[0]) {
	case 'a':
		if (strcmp(key, "all") == 0)
			keybit = ~0;
		break;
	case 'c':
		if (strcmp(key, "cksum") == 0)
			keybit = F_CKSUM;
		break;
	case 'd':
		if (strcmp(key, "device") == 0)
			keybit = F_DEV;
		else if (strcmp(key, "dironly") == 0) {
			mtree->dironly = (value != NULL)? 1: 0;
			return (ARCHIVE_OK);
		}
		break;
	case 'f':
		if (strcmp(key, "flags") == 0)
			keybit = F_FLAGS;
		break;
	case 'g':
		if (strcmp(key, "gid") == 0)
			keybit = F_GID;
		else if (strcmp(key, "gname") == 0)
			keybit = F_GNAME;
		break;
	case 'i':
		if (strcmp(key, "indent") == 0) {
			mtree->indent = (value != NULL)? 1: 0;
			return (ARCHIVE_OK);
		} else if (strcmp(key, "inode") == 0) {
			keybit = F_INO;
		}
		break;
	case 'l':
		if (strcmp(key, "link") == 0)
			keybit = F_SLINK;
		break;
	case 'm':
		if (strcmp(key, "md5") == 0 ||
		    strcmp(key, "md5digest") == 0)
			keybit = F_MD5;
		if (strcmp(key, "mode") == 0)
			keybit = F_MODE;
		break;
	case 'n':
		if (strcmp(key, "nlink") == 0)
			keybit = F_NLINK;
		break;
	case 'r':
		if (strcmp(key, "resdevice") == 0) {
			keybit = F_RESDEV;
		} else if (strcmp(key, "ripemd160digest") == 0 ||
		    strcmp(key, "rmd160") == 0 ||
		    strcmp(key, "rmd160digest") == 0)
			keybit = F_RMD160;
		break;
	case 's':
		if (strcmp(key, "sha1") == 0 ||
		    strcmp(key, "sha1digest") == 0)
			keybit = F_SHA1;
		if (strcmp(key, "sha256") == 0 ||
		    strcmp(key, "sha256digest") == 0)
			keybit = F_SHA256;
		if (strcmp(key, "sha384") == 0 ||
		    strcmp(key, "sha384digest") == 0)
			keybit = F_SHA384;
		if (strcmp(key, "sha512") == 0 ||
		    strcmp(key, "sha512digest") == 0)
			keybit = F_SHA512;
		if (strcmp(key, "size") == 0)
			keybit = F_SIZE;
		break;
	case 't':
		if (strcmp(key, "time") == 0)
			keybit = F_TIME;
		else if (strcmp(key, "type") == 0)
			keybit = F_TYPE;
		break;
	case 'u':
		if (strcmp(key, "uid") == 0)
			keybit = F_UID;
		else if (strcmp(key, "uname") == 0)
			keybit = F_UNAME;
		else if (strcmp(key, "use-set") == 0) {
			mtree->output_global_set = (value != NULL)? 1: 0;
			return (ARCHIVE_OK);
		}
		break;
	}
	if (keybit != 0) {
		if (value != NULL)
			mtree->keys |= keybit;
		else
			mtree->keys &= ~keybit;
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}